

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::isLegalTesterForTarget(GLenum target,TesterType tester)

{
  bool bVar1;
  TesterType tester_local;
  GLenum target_local;
  
  if (((tester == TESTER_TEXTURE_WRAP_R) || (tester == TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER)) &&
     (target != 0x806f)) {
    tester_local._3_1_ = TESTER_TEXTURE_SWIZZLE_R >> 0x18;
  }
  else {
    bVar1 = isMultisampleTarget(target);
    if ((bVar1) && (bVar1 = isSamplerStateTester(tester), bVar1)) {
      tester_local._3_1_ = TESTER_TEXTURE_SWIZZLE_R >> 0x18;
    }
    else if (target == 0x8c2a) {
      tester_local._3_1_ = TESTER_TEXTURE_SWIZZLE_R >> 0x18;
    }
    else {
      tester_local._3_1_ = 1;
    }
  }
  return (bool)tester_local._3_1_;
}

Assistant:

bool isLegalTesterForTarget (glw::GLenum target, TesterType tester)
{
	// no 3d filtering on 2d targets
	if ((tester == TESTER_TEXTURE_WRAP_R || tester == TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER) &&  target != GL_TEXTURE_3D)
		return false;

	// no sampling on multisample
	if (isMultisampleTarget(target) && isSamplerStateTester(tester))
		return false;

	// no states in buffer
	if (target == GL_TEXTURE_BUFFER)
		return false;

	return true;
}